

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QString * tabTextFor(QString *__return_storage_ptr__,QMdiSubWindow *subWindow)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (subWindow == (QMdiSubWindow *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0040c46e;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::windowTitle((QString *)&local_48,&subWindow->super_QWidget);
    bVar4 = QWidget::isWindowModified(&subWindow->super_QWidget);
    if (bVar4) {
      QString::replace((QLatin1String *)&local_48,(QLatin1String *)0x3,0x5ea6f4);
    }
    else {
      qt_setWindowTitle_helperHelper
                ((QString *)&local_68,(QString *)&local_48,&subWindow->super_QWidget);
      qVar3 = local_48.size;
      pcVar2 = local_48.ptr;
      pDVar1 = local_48.d;
      local_48.d = local_68.d;
      local_48.ptr = local_68.ptr;
      local_68.d = pDVar1;
      local_68.ptr = pcVar2;
      local_48.size = local_68.size;
      local_68.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
    if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
      QMdiArea::tr(__return_storage_ptr__,"(Untitled)",(char *)0x0,-1);
    }
    else {
      (__return_storage_ptr__->d).d = local_48.d;
      (__return_storage_ptr__->d).ptr = local_48.ptr;
      (__return_storage_ptr__->d).size = local_48.size;
      if (local_48.d != (Data *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0040c46e:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static inline QString tabTextFor(QMdiSubWindow *subWindow)
{
    if (!subWindow)
        return QString();

    QString title = subWindow->windowTitle();
    if (subWindow->isWindowModified()) {
        title.replace("[*]"_L1, "*"_L1);
    } else {
        extern QString qt_setWindowTitle_helperHelper(const QString&, const QWidget*);
        title = qt_setWindowTitle_helperHelper(title, subWindow);
    }

    return title.isEmpty() ? QMdiArea::tr("(Untitled)") : title;
}